

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<std::pair<unsigned_int,_int>_>::Stack
          (Stack<std::pair<unsigned_int,_int>_> *this,Stack<std::pair<unsigned_int,_int>_> *s)

{
  BottomFirstIterator it;
  pair<unsigned_int,_int> *ppVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = s->_capacity;
  this->_capacity = sVar2;
  if (sVar2 == 0) {
    this->_stack = (pair<unsigned_int,_int> *)0x0;
    sVar2 = 0;
    ppVar1 = (pair<unsigned_int,_int> *)0x0;
  }
  else {
    uVar3 = sVar2 * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar3 == 0) {
      ppVar1 = (pair<unsigned_int,_int> *)
               FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar3 < 0x11) {
      ppVar1 = (pair<unsigned_int,_int> *)
               FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar3 < 0x19) {
      ppVar1 = (pair<unsigned_int,_int> *)
               FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar3 < 0x21) {
      ppVar1 = (pair<unsigned_int,_int> *)
               FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar3 < 0x31) {
      ppVar1 = (pair<unsigned_int,_int> *)
               FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar3 < 0x41) {
      ppVar1 = (pair<unsigned_int,_int> *)
               FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      ppVar1 = (pair<unsigned_int,_int> *)::operator_new(uVar3,0x10);
    }
    this->_stack = ppVar1;
    sVar2 = this->_capacity;
  }
  this->_cursor = ppVar1;
  this->_end = ppVar1 + sVar2;
  it._pointer = s->_stack;
  it._afterLast = s->_cursor;
  Stack<std::pair<unsigned_int,int>>::
  loadFromIterator<Lib::Stack<std::pair<unsigned_int,int>>::BottomFirstIterator>
            ((Stack<std::pair<unsigned_int,int>> *)this,it);
  return;
}

Assistant:

Stack(const Stack& s)
   : _capacity(s._capacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = 0;
    }
    _cursor = _stack;
    _end = _stack+_capacity;

    loadFromIterator(BottomFirstIterator(const_cast<Stack&>(s)));
  }